

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_TestMaxStructDepths_Test::TestBody(TypeTest_TestMaxStructDepths_Test *this)

{
  allocator<wasm::HeapType> *this_00;
  initializer_list<wasm::HeapType> __l;
  bool bVar1;
  Entry *pEVar2;
  char *pcVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar4;
  mapped_type *pmVar5;
  char *in_R9;
  Entry EVar6;
  optional<wasm::HeapType> other;
  AssertHelper local_2e0;
  Message local_2d8;
  uint local_2cc;
  HeapType local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_4;
  Message local_2a8;
  uint local_29c;
  HeapType local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_3;
  Message local_278;
  uint local_26c;
  HeapType local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_2;
  Message local_248;
  uint local_23c;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_1;
  Message local_220;
  uint local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  maxDepths;
  HeapType local_1c0;
  unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_> local_1b8;
  iterator local_1b0;
  size_type local_1a8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> local_1a0;
  undefined1 local_188 [8];
  SubTypes subTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_118;
  AssertHelper local_f8;
  Message local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  undefined1 local_a8 [12];
  Entry local_98;
  Struct local_88 [2];
  Entry local_58;
  Struct local_48;
  TypeBuilder local_28;
  TypeBuilder builder;
  HeapType B;
  HeapType A;
  TypeTest_TestMaxStructDepths_Test *this_local;
  
  ::wasm::HeapType::HeapType(&B);
  ::wasm::HeapType::HeapType((HeapType *)&builder);
  ::wasm::TypeBuilder::TypeBuilder(&local_28,2);
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_48);
  local_58 = ::wasm::TypeBuilder::operator[](&local_28,0);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_58,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_48);
  ::wasm::Struct::~Struct(&local_48);
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(local_88);
  local_98 = ::wasm::TypeBuilder::operator[](&local_28,1);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_98,true);
  EVar6 = ::wasm::TypeBuilder::operator[](&local_28,0);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar6.builder;
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_a8,
             (Entry *)((long)&result.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18));
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_a8._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_a8[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_a8._9_3_;
  pEVar2 = ::wasm::TypeBuilder::Entry::subTypeOf(pEVar2,other);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,local_88);
  ::wasm::Struct::~Struct(local_88);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_e8,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)local_e8,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x639,pcVar3);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  if (bVar1) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket,__x);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,0);
    B.id = pvVar4->id;
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &subTypes.typeSubTypes._M_h._M_single_bucket,1);
    builder.impl._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
         pvVar4->id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &subTypes.typeSubTypes._M_h._M_single_bucket);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_28);
  if (bVar1) {
    local_1c0.id = B.id;
    local_1b8._M_t.
    super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
    .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
          )(__uniq_ptr_data<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>,_true,_true>
            )builder.impl._M_t.
             super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
             .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
    local_1b0 = &local_1c0;
    local_1a8 = 2;
    this_00 = (allocator<wasm::HeapType> *)((long)&maxDepths._M_h._M_single_bucket + 7);
    std::allocator<wasm::HeapType>::allocator(this_00);
    __l._M_len = local_1a8;
    __l._M_array = local_1b0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector(&local_1a0,__l,this_00);
    ::wasm::SubTypes::SubTypes((SubTypes *)local_188,&local_1a0);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector(&local_1a0);
    std::allocator<wasm::HeapType>::~allocator
              ((allocator<wasm::HeapType> *)((long)&maxDepths._M_h._M_single_bucket + 7));
    ::wasm::SubTypes::getMaxDepths
              ((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                *)&gtest_ar.message_,(SubTypes *)local_188);
    pmVar5 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,(key_type *)&builder);
    local_214 = 0;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_210,"maxDepths[B]","Index(0)",pmVar5,&local_214);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_220);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x642,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_220);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_220);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    pmVar5 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&B);
    local_23c = 1;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_238,"maxDepths[A]","Index(1)",pmVar5,&local_23c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_248);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x643,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_248);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_248);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    ::wasm::HeapType::HeapType(&local_268,struct_);
    pmVar5 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_268);
    local_26c = 2;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_260,"maxDepths[HeapType::struct_]","Index(2)",pmVar5,&local_26c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x644,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_278);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
    ::wasm::HeapType::HeapType(&local_298,eq);
    pmVar5 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_298);
    local_29c = 3;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_290,"maxDepths[HeapType::eq]","Index(3)",pmVar5,&local_29c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
    if (!bVar1) {
      testing::Message::Message(&local_2a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x645,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_2a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
    ::wasm::HeapType::HeapType(&local_2c8,any);
    pmVar5 = std::
             unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
             ::operator[]((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                           *)&gtest_ar.message_,&local_2c8);
    local_2cc = 4;
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((EqHelper *)local_2c0,"maxDepths[HeapType::any]","Index(4)",pmVar5,&local_2cc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x646,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message(&local_2d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
    std::
    unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
    ::~unordered_map((unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                      *)&gtest_ar.message_);
    ::wasm::SubTypes::~SubTypes((SubTypes *)local_188);
  }
  return;
}

Assistant:

TEST_F(TypeTest, TestMaxStructDepths) {
  /*
      A
      |
      B
  */
  HeapType A, B;
  {
    TypeBuilder builder(2);
    builder[0].setOpen() = Struct();
    builder[1].setOpen().subTypeOf(builder[0]) = Struct();
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
  }

  SubTypes subTypes({A, B});
  auto maxDepths = subTypes.getMaxDepths();

  EXPECT_EQ(maxDepths[B], Index(0));
  EXPECT_EQ(maxDepths[A], Index(1));
  EXPECT_EQ(maxDepths[HeapType::struct_], Index(2));
  EXPECT_EQ(maxDepths[HeapType::eq], Index(3));
  EXPECT_EQ(maxDepths[HeapType::any], Index(4));
}